

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

size_t FNV2(char *key,int len,size_t seed)

{
  uint8_t *endc;
  uint8_t *dc;
  size_t *endw;
  size_t *dw;
  size_t h;
  size_t seed_local;
  int len_local;
  char *key_local;
  
  h = seed ^ 0xcbf29ce484222325;
  for (dw = (size_t *)key; dw < key + ((long)len & 0xfffffffffffffff8); dw = dw + 1) {
    h = (*dw ^ h) * 0x100000001b3;
  }
  if ((len & 7U) != 0) {
    for (dc = (uint8_t *)dw; dc < key + len; dc = dc + 1) {
      h = (*dc ^ h) * 0x100000001b3;
    }
  }
  return h;
}

Assistant:

size_t
FNV2(const char *key, int len, size_t seed)
{
  size_t h = seed;
  size_t *dw = (size_t *)key; //word stepper
  const size_t *const endw = &((const size_t*)key)[len/sizeof(size_t)];
#ifdef HAVE_BIT32
  h ^= UINT32_C(2166136261);
#else
  h ^= UINT64_C(0xcbf29ce484222325);
#endif
  while (dw < endw) {
    h ^= *dw++;
#ifdef HAVE_BIT32
    h *= UINT32_C(16777619);
#else
    h *= UINT64_C(0x100000001b3);
#endif
  }
  if (len & (sizeof(size_t)-1)) {
    uint8_t *dc = (uint8_t*)dw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (dc < endc) {
      h ^= *dc++;
#ifdef HAVE_BIT32
      h *= UINT32_C(16777619);
#else
      h *= UINT64_C(0x100000001b3);
#endif
    }
  }
  return h;
}